

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx2::forward_int8_x86
          (ConvolutionDepthWise_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  int *piVar3;
  void *pvVar4;
  Layer *pLVar5;
  float fVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 auVar24 [32];
  undefined1 uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  undefined4 *puVar31;
  ulong uVar32;
  long lVar33;
  _func_int *p_Var34;
  ulong uVar35;
  long lVar36;
  uint uVar37;
  int iVar38;
  int iVar39;
  float fVar40;
  int iVar41;
  Option *_elemsize;
  Option *opt_00;
  _func_int **pp_Var42;
  int iVar43;
  pointer pfVar44;
  int iVar45;
  undefined1 (*pauVar46) [16];
  undefined1 (*pauVar47) [16];
  ulong uVar48;
  bool bVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [64];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [64];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar207;
  undefined1 auVar205 [16];
  undefined1 auVar206 [64];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  Option opt_q;
  float top_rescale;
  Mat bottom_blob_bordered;
  float scale_out;
  Option opt_g;
  int local_354;
  undefined1 local_338 [32];
  undefined1 local_318 [32];
  size_t local_2f8;
  float *local_2e8;
  float *local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  Mat *local_2c8;
  ulong local_2c0;
  _func_int **local_2b8;
  pointer local_2b0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [40];
  undefined1 auStack_270 [16];
  ulong uStack_260;
  size_t local_258;
  ulong local_250;
  Mat local_248;
  undefined8 local_1f8;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  Allocator *local_1e8;
  int local_1e0;
  Allocator *local_1d8;
  undefined1 local_1d0 [16];
  int local_1c0;
  ulong local_1b8;
  long local_1b0;
  void *local_1a8;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  Allocator *local_198;
  int local_190;
  Allocator *local_188;
  undefined1 local_180 [16];
  int local_170;
  ulong local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  long local_130;
  undefined1 local_128 [56];
  int local_f0;
  size_t local_e8;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar9;
  undefined3 uVar11;
  undefined2 uVar13;
  undefined4 uVar18;
  undefined3 uVar20;
  undefined2 uVar22;
  
  local_128._24_4_ = bottom_blob->elempack;
  local_f0 = bottom_blob->c;
  if (local_128._24_4_ == 0) {
    bVar49 = false;
  }
  else {
    bVar49 = ((int)bottom_blob->elemsize << 3) / (int)local_128._24_4_ == 8;
  }
  p_Var34 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
  iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var34);
  iVar43 = *(int *)(&this->field_0xd8 + (long)p_Var34);
  iVar38 = *(int *)(&this->field_0xdc + (long)p_Var34);
  iVar45 = *(int *)(&this->field_0xe0 + (long)p_Var34);
  piVar3 = bottom_blob->refcount;
  local_128._0_8_ = bottom_blob->data;
  local_128._8_4_ = SUB84(bottom_blob->refcount,0);
  local_128._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_128._16_8_ = bottom_blob->elemsize;
  local_128._32_8_ = bottom_blob->allocator;
  local_128._40_4_ = bottom_blob->dims;
  local_128._44_4_ = bottom_blob->w;
  local_128._48_4_ = bottom_blob->h;
  local_128._52_4_ = bottom_blob->d;
  local_e8 = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (!bVar49) {
    uVar35 = (long)(local_128._24_4_ * local_f0) /
             (long)*(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]
                           );
    local_248.cstep = 0;
    local_248.data = (undefined4 *)0x0;
    local_248.refcount._0_4_ = 0;
    local_248.refcount._4_4_ = 0;
    local_248.elemsize = 0;
    local_248.elempack = 0;
    local_248.allocator = (Allocator *)0x0;
    local_248.dims = 0;
    local_248.w = 0;
    local_248.h = 0;
    local_248.d = 0;
    local_248.c = 0;
    local_2c8 = top_blob;
    Mat::create(&local_248,local_128._24_4_ * local_f0,4,(Allocator *)0x0);
    top_blob = local_2c8;
    pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx2;
    p_Var34 = pp_Var42[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var34)) {
      lVar33 = 0;
      puVar31 = (undefined4 *)local_248.data;
      do {
        if (0 < (int)uVar35) {
          uVar2 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var34) + lVar33 * 4);
          uVar48 = uVar35 & 0xffffffff;
          do {
            *puVar31 = uVar2;
            puVar31 = puVar31 + 1;
            uVar37 = (int)uVar48 - 1;
            uVar48 = (ulong)uVar37;
          } while (uVar37 != 0);
        }
        lVar33 = lVar33 + 1;
        p_Var34 = pp_Var42[-3];
      } while (lVar33 < *(int *)(&this->field_0x108 + (long)p_Var34));
    }
    local_338._0_8_ = *(undefined8 *)opt;
    local_338._16_8_ = opt->workspace_allocator;
    uVar7 = opt->openmp_blocktime;
    uVar8 = opt->use_winograd_convolution;
    uVar10 = opt->use_sgemm_convolution;
    uVar12 = opt->use_int8_inference;
    uVar14 = opt->use_vulkan_compute;
    uVar13 = CONCAT11(uVar14,uVar12);
    uVar11 = CONCAT21(uVar13,uVar10);
    uVar9 = CONCAT31(uVar11,uVar8);
    local_318[0] = opt->use_bf16_storage;
    local_318[1] = opt->use_fp16_packed;
    local_318[2] = opt->use_fp16_storage;
    local_318[3] = opt->use_fp16_arithmetic;
    local_318[4] = opt->use_int8_packed;
    local_318[5] = opt->use_int8_storage;
    local_318[6] = opt->use_int8_arithmetic;
    local_318[7] = opt->use_packing_layout;
    local_318[8] = opt->use_shader_pack8;
    local_318[9] = opt->use_subgroup_basic;
    local_318[10] = opt->use_subgroup_vote;
    local_318[0xb] = opt->use_subgroup_ballot;
    local_318[0xc] = opt->use_subgroup_shuffle;
    local_318[0xd] = opt->use_image_storage;
    local_318[0xe] = opt->use_tensor_storage;
    local_318[0xf] = opt->use_weight_fp16_storage;
    local_318._16_4_ = opt->flush_denormals;
    local_318[0x14] = opt->use_local_pool_allocator;
    local_318[0x15] = opt->use_reserved_1;
    local_318[0x16] = opt->use_reserved_2;
    local_318[0x17] = opt->use_reserved_3;
    local_318[0x18] = opt->use_reserved_4;
    local_318[0x19] = opt->use_reserved_5;
    local_318[0x1a] = opt->use_reserved_6;
    local_318[0x1b] = opt->use_reserved_7;
    local_318[0x1c] = opt->use_reserved_8;
    local_318[0x1d] = opt->use_reserved_9;
    local_318[0x1e] = opt->use_reserved_10;
    local_318[0x1f] = opt->use_reserved_11;
    local_338._8_4_ = SUB84(opt->workspace_allocator,0);
    local_338._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_338._24_4_ = uVar7;
    local_338._28_4_ = uVar9;
    quantize_to_int8(bottom_blob,(Mat *)local_128,&local_248,(Option *)local_338);
    piVar3 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_248.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_248.data != (undefined4 *)0x0) {
            free(local_248.data);
          }
        }
        else {
          (*(local_248.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_248.cstep = 0;
  local_248.data = (pointer)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize = 0;
  local_248.elempack = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 +
             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]),(Mat *)local_128,&local_248,opt);
  auVar76 = local_158;
  iVar30 = -100;
  local_338._8_8_ = (Allocator *)CONCAT44(local_338._12_4_,local_338._8_4_);
  if (((pointer)local_248.data == (pointer)0x0) ||
     (local_338._8_8_ = (Allocator *)CONCAT44(local_338._12_4_,local_338._8_4_),
     (long)local_248.c * local_248.cstep == 0)) goto LAB_0029a0fa;
  local_158._4_4_ = 0;
  local_158._0_4_ = local_248.c;
  p_Var34 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
  iVar28 = (~((iVar28 + -1) * iVar38) + local_248.w) / *(int *)(&this->field_0xe4 + (long)p_Var34);
  iVar38 = iVar28 + 1;
  uVar35 = (long)(~((iVar43 + -1) * iVar45) + local_248.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var34);
  local_250 = uVar35 & 0xffffffff;
  iVar43 = (int)uVar35 + 1;
  local_2b8 = (_func_int **)CONCAT44(local_2b8._4_4_,local_248.elempack);
  uVar37 = local_248.c * local_248.elempack;
  if ((uVar37 == *(uint *)(&this->field_0x108 + (long)p_Var34)) &&
     (uVar27 = *(uint *)(&this->field_0xd0 + (long)p_Var34),
     *(uint *)(&this->field_0x108 + (long)p_Var34) == uVar27)) {
    local_158._8_8_ = auVar76._8_8_;
    local_2c0 = CONCAT44(local_2c0._4_4_,local_248.w);
    uVar37 = 8;
    if (opt->use_packing_layout == false) {
      uVar37 = 1;
    }
    if ((uVar27 & 7) != 0) {
      uVar37 = 1;
    }
    opt_00 = (Option *)(ulong)uVar37;
    iVar45 = *(int *)(&this->field_0x10c + (long)p_Var34);
    _elemsize = (Option *)(ulong)(uVar37 * 4);
    if (100 < iVar45) {
      _elemsize = opt_00;
    }
    Mat::create(top_blob,iVar38,iVar43,(int)uVar27 / (int)uVar37,(size_t)_elemsize,uVar37,
                opt->blob_allocator);
    iVar30 = -100;
    local_338._8_8_ = (Allocator *)CONCAT44(local_338._12_4_,local_338._8_4_);
    if ((top_blob->data == (void *)0x0) ||
       (local_338._8_8_ = (Allocator *)CONCAT44(local_338._12_4_,local_338._8_4_),
       (long)top_blob->c * top_blob->cstep == 0)) goto LAB_0029a0fa;
    iVar30 = 0;
    if ((int)local_2b8 != 1) {
      local_338._8_8_ = (Allocator *)CONCAT44(local_338._12_4_,local_338._8_4_);
      if ((int)local_2b8 != 8) goto LAB_0029a0fa;
      uVar35 = (long)*(int *)(&this->field_0xd8 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) *
               (long)*(int *)(&this->field_0xd4 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_338,uVar35,(allocator_type *)local_298);
      pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx2;
      p_Var34 = pp_Var42[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var34)) {
        iVar43 = *(int *)(&this->field_0xe0 + (long)p_Var34);
        iVar38 = *(int *)(&this->field_0xdc + (long)p_Var34);
        iVar30 = *(int *)(&this->field_0xd4 + (long)p_Var34);
        iVar39 = 0;
        fVar40 = 0.0;
        iVar41 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var42[-3])) {
            lVar33 = 0;
            do {
              *(float *)(local_338._0_8_ + (iVar39 + lVar33) * 4) = fVar40;
              fVar40 = (float)((int)fVar40 + *(int *)(&this->field_0xdc + (long)pp_Var42[-3]));
              lVar33 = lVar33 + 1;
            } while ((int)lVar33 < *(int *)(&this->field_0xd4 + (long)pp_Var42[-3]));
            iVar39 = iVar39 + (int)lVar33;
          }
          fVar40 = (float)((int)fVar40 + (iVar43 * (int)local_2c0 - iVar38 * iVar30));
          iVar41 = iVar41 + 1;
          opt_00 = (Option *)pp_Var42[-3];
        } while (iVar41 < *(int *)(&this->field_0xd8 + (long)opt_00));
      }
      local_2a8._0_8_ = opt;
      if (0 < (int)local_158._0_4_) {
        iVar43 = (int)uVar35 * 8;
        local_148._0_4_ = iVar43;
        local_2b0 = (pointer)0x0;
        auVar143 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar148 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        local_2d8 = 0;
        do {
          if (-1 < (int)local_250) {
            local_2e8 = (float *)(local_248.cstep * local_2d8 * local_248.elemsize +
                                 (long)local_248.data);
            pauVar46 = (undefined1 (*) [16])
                       (top_blob->cstep * local_2d8 * top_blob->elemsize + (long)top_blob->data);
            pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx2;
            opt_00 = (Option *)(local_2d8 * 8);
            pvVar4 = (this->weight_data_int8).data;
            uVar48 = 0;
            pauVar47 = pauVar46;
            do {
              local_2d0 = uVar48;
              iVar38 = (int)local_2d0;
              if (-1 < iVar28) {
                local_2e0 = (float *)(long)iVar38;
                iVar30 = 0;
                do {
                  p_Var34 = pp_Var42[-3];
                  if ((int)uVar35 < 1) {
                    auVar173 = ZEXT816(0) << 0x40;
                    auVar76 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar165 = ZEXT1664((undefined1  [16])0x0);
                    uVar48 = 0;
                    auVar206 = ZEXT1664((undefined1  [16])0x0);
                    do {
                      auVar173._8_8_ = 0;
                      auVar173._0_8_ =
                           *(ulong *)((long)local_2e8 +
                                     (long)(int)*(pointer)(local_338._0_8_ + uVar48 * 4) * 8 +
                                     (long)*(int *)(&this->field_0xe8 + (long)p_Var34) *
                                     (long)local_2e0 * (long)local_248.w * local_248.elemsize +
                                     (long)(*(int *)(&this->field_0xe4 + (long)p_Var34) * iVar30 * 8
                                           ));
                      auVar76 = vpcmpgtb_avx((undefined1  [16])0x0,auVar173);
                      auVar173 = vpunpcklbw_avx(auVar173,auVar76);
                      auVar73._8_8_ = 0;
                      auVar73._0_8_ = *(ulong *)((long)pvVar4 + uVar48 * 8 + (long)(int)local_2b0);
                      auVar76 = vpcmpgtb_avx((undefined1  [16])0x0,auVar73);
                      auVar76 = vpunpcklbw_avx(auVar73,auVar76);
                      auVar73 = vpmullw_avx(auVar76,auVar173);
                      auVar173 = vpmulhw_avx(auVar173,auVar76);
                      auVar76 = vpunpcklwd_avx(auVar73,auVar173);
                      auVar76 = vpaddd_avx(auVar165._0_16_,auVar76);
                      auVar165 = ZEXT1664(auVar76);
                      auVar173 = vpunpckhwd_avx(auVar73,auVar173);
                      auVar173 = vpaddd_avx(auVar206._0_16_,auVar173);
                      auVar206 = ZEXT1664(auVar173);
                      uVar48 = uVar48 + 1;
                    } while ((uVar35 & 0xffffffff) != uVar48);
                    auVar76 = vcvtdq2ps_avx(auVar76);
                    auVar173 = vcvtdq2ps_avx(auVar173);
                  }
                  auVar73 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0x1f8 + (long)p_Var34) + local_2d8 * 0x20);
                  auVar208 = *(undefined1 (*) [16])
                              (*(long *)(&this->field_0x1f8 + (long)p_Var34) + 0x10 +
                              local_2d8 * 0x20);
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var34) +
                                    local_2d8 * 0x20);
                  auVar51._0_4_ = auVar73._0_4_ * *pfVar1;
                  auVar51._4_4_ = auVar73._4_4_ * pfVar1[1];
                  auVar51._8_4_ = auVar73._8_4_ * pfVar1[2];
                  auVar51._12_4_ = auVar73._12_4_ * pfVar1[3];
                  auVar204 = vrcpps_avx(auVar51);
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var34) + 0x10 +
                                    local_2d8 * 0x20);
                  auVar74._0_4_ = auVar208._0_4_ * *pfVar1;
                  auVar74._4_4_ = auVar208._4_4_ * pfVar1[1];
                  auVar74._8_4_ = auVar208._8_4_ * pfVar1[2];
                  auVar74._12_4_ = auVar208._12_4_ * pfVar1[3];
                  auVar51 = vrcpps_avx(auVar74);
                  auVar73 = vcmpps_avx(auVar73,(undefined1  [16])0x0,4);
                  auVar73 = vandps_avx(auVar73,auVar204);
                  auVar204._0_4_ = auVar76._0_4_ * auVar73._0_4_;
                  auVar204._4_4_ = auVar76._4_4_ * auVar73._4_4_;
                  auVar204._8_4_ = auVar76._8_4_ * auVar73._8_4_;
                  auVar204._12_4_ = auVar76._12_4_ * auVar73._12_4_;
                  auVar76 = vcmpps_avx(auVar208,(undefined1  [16])0x0,4);
                  auVar76 = vandps_avx(auVar76,auVar51);
                  auVar208._0_4_ = auVar76._0_4_ * auVar173._0_4_;
                  auVar208._4_4_ = auVar76._4_4_ * auVar173._4_4_;
                  auVar208._8_4_ = auVar76._8_4_ * auVar173._8_4_;
                  auVar208._12_4_ = auVar76._12_4_ * auVar173._12_4_;
                  if (*(int *)(&this->field_0x100 + (long)p_Var34) != 0) {
                    pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var34) +
                                      local_2d8 * 0x20);
                    auVar204._0_4_ = auVar204._0_4_ + *pfVar1;
                    auVar204._4_4_ = auVar204._4_4_ + pfVar1[1];
                    auVar204._8_4_ = auVar204._8_4_ + pfVar1[2];
                    auVar204._12_4_ = auVar204._12_4_ + pfVar1[3];
                    pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var34) + 0x10 +
                                      local_2d8 * 0x20);
                    auVar208._0_4_ = auVar208._0_4_ + *pfVar1;
                    auVar208._4_4_ = auVar208._4_4_ + pfVar1[1];
                    auVar208._8_4_ = auVar208._8_4_ + pfVar1[2];
                    auVar208._12_4_ = auVar208._12_4_ + pfVar1[3];
                  }
                  iVar39 = *(int *)(&this->field_0x110 + (long)p_Var34) + -1;
                  auVar76 = auVar143._0_16_;
                  auVar173 = auVar148._0_16_;
                  fVar40 = auVar204._4_4_;
                  fVar50 = auVar204._8_4_;
                  fVar207 = auVar204._12_4_;
                  switch(iVar39) {
                  case 0:
                    auVar204 = vmaxps_avx(auVar204,(undefined1  [16])0x0);
                    break;
                  case 1:
                    auVar76 = vmaxps_avx(auVar204,(undefined1  [16])0x0);
                    auVar173 = vminps_avx(auVar204,(undefined1  [16])0x0);
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var34);
                    auVar205._4_4_ = uVar2;
                    auVar205._0_4_ = uVar2;
                    auVar205._8_4_ = uVar2;
                    auVar205._12_4_ = uVar2;
                    auVar204 = vfmadd213ps_fma(auVar205,auVar173,auVar76);
                    break;
                  case 2:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var34);
                    auVar58._4_4_ = uVar2;
                    auVar58._0_4_ = uVar2;
                    auVar58._8_4_ = uVar2;
                    auVar58._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var34))[1];
                    auVar79._4_4_ = uVar2;
                    auVar79._0_4_ = uVar2;
                    auVar79._8_4_ = uVar2;
                    auVar79._12_4_ = uVar2;
                    auVar76 = vmaxps_avx(auVar204,auVar58);
                    auVar204 = vminps_avx(auVar76,auVar79);
                    break;
                  case 3:
                    auVar59._0_8_ = auVar204._0_8_ ^ 0x8000000080000000;
                    auVar59._8_4_ = -fVar50;
                    auVar59._12_4_ = -fVar207;
                    auVar80._8_4_ = 0x42b0c0a5;
                    auVar80._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar80._12_4_ = 0x42b0c0a5;
                    auVar73 = vminps_avx(auVar59,auVar80);
                    auVar81._8_4_ = 0xc2b0c0a5;
                    auVar81._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar81._12_4_ = 0xc2b0c0a5;
                    auVar51 = vmaxps_avx(auVar73,auVar81);
                    auVar82._8_4_ = 0x3fb8aa3b;
                    auVar82._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar82._12_4_ = 0x3fb8aa3b;
                    auVar73 = vfmadd213ps_fma(auVar82,auVar51,auVar76);
                    auVar153._0_4_ = (int)auVar73._0_4_;
                    auVar153._4_4_ = (int)auVar73._4_4_;
                    auVar153._8_4_ = (int)auVar73._8_4_;
                    auVar153._12_4_ = (int)auVar73._12_4_;
                    auVar204 = vcvtdq2ps_avx(auVar153);
                    auVar73 = vcmpps_avx(auVar73,auVar204,1);
                    auVar73 = vandps_avx(auVar73,auVar173);
                    auVar73 = vsubps_avx(auVar204,auVar73);
                    auVar114._8_4_ = 0xbf317218;
                    auVar114._0_8_ = 0xbf317218bf317218;
                    auVar114._12_4_ = 0xbf317218;
                    auVar51 = vfmadd231ps_fma(auVar51,auVar73,auVar114);
                    fVar40 = auVar51._0_4_;
                    auVar154._0_4_ = fVar40 * fVar40;
                    fVar50 = auVar51._4_4_;
                    auVar154._4_4_ = fVar50 * fVar50;
                    fVar207 = auVar51._8_4_;
                    auVar154._8_4_ = fVar207 * fVar207;
                    fVar6 = auVar51._12_4_;
                    auVar154._12_4_ = fVar6 * fVar6;
                    auVar201._8_4_ = 0x39506967;
                    auVar201._0_8_ = 0x3950696739506967;
                    auVar201._12_4_ = 0x39506967;
                    auVar115._8_4_ = 0x3ab743ce;
                    auVar115._0_8_ = 0x3ab743ce3ab743ce;
                    auVar115._12_4_ = 0x3ab743ce;
                    auVar204 = vfmadd213ps_fma(auVar201,auVar51,auVar115);
                    auVar116._8_4_ = 0x3c088908;
                    auVar116._0_8_ = 0x3c0889083c088908;
                    auVar116._12_4_ = 0x3c088908;
                    auVar204 = vfmadd213ps_fma(auVar204,auVar51,auVar116);
                    auVar117._8_4_ = 0x3d2aa9c1;
                    auVar117._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar117._12_4_ = 0x3d2aa9c1;
                    auVar204 = vfmadd213ps_fma(auVar204,auVar51,auVar117);
                    auVar118._8_4_ = 0x3e2aaaaa;
                    auVar118._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar118._12_4_ = 0x3e2aaaaa;
                    auVar204 = vfmadd213ps_fma(auVar204,auVar51,auVar118);
                    auVar76 = vfmadd213ps_fma(auVar204,auVar51,auVar76);
                    auVar60._0_4_ = fVar40 + auVar148._0_4_;
                    auVar60._4_4_ = fVar50 + auVar148._4_4_;
                    auVar60._8_4_ = fVar207 + auVar148._8_4_;
                    auVar60._12_4_ = fVar6 + auVar148._12_4_;
                    auVar204 = vfmadd231ps_fma(auVar60,auVar154,auVar76);
                    auVar83._0_4_ = (int)auVar73._0_4_;
                    auVar83._4_4_ = (int)auVar73._4_4_;
                    auVar83._8_4_ = (int)auVar73._8_4_;
                    auVar83._12_4_ = (int)auVar73._12_4_;
                    auVar76 = vpslld_avx(auVar83,0x17);
                    auVar155._8_4_ = 0x3f800000;
                    auVar155._0_8_ = 0x3f8000003f800000;
                    auVar155._12_4_ = 0x3f800000;
                    auVar76 = vpaddd_avx(auVar76,auVar155);
                    auVar73 = vfmadd213ps_fma(auVar76,auVar204,auVar173);
                    auVar76 = vrcpps_avx(auVar73);
                    auVar173 = vfmsub213ps_fma(auVar73,auVar76,auVar173);
                    auVar204 = vfnmadd132ps_fma(auVar173,auVar76,auVar76);
                    break;
                  case 4:
                    auVar99._8_4_ = 0x42b0c0a5;
                    auVar99._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar99._12_4_ = 0x42b0c0a5;
                    auVar73 = vminps_avx(auVar204,auVar99);
                    auVar191._8_4_ = 0xc2b0c0a5;
                    auVar191._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar191._12_4_ = 0xc2b0c0a5;
                    auVar51 = vmaxps_avx(auVar191,auVar73);
                    auVar193._8_4_ = 0x3fb8aa3b;
                    auVar193._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar193._12_4_ = 0x3fb8aa3b;
                    auVar76 = vfmadd213ps_fma(auVar193,auVar51,auVar76);
                    auVar149._0_4_ = (int)auVar76._0_4_;
                    auVar149._4_4_ = (int)auVar76._4_4_;
                    auVar149._8_4_ = (int)auVar76._8_4_;
                    auVar149._12_4_ = (int)auVar76._12_4_;
                    auVar73 = vcvtdq2ps_avx(auVar149);
                    auVar76 = vcmpps_avx(auVar76,auVar73,1);
                    auVar76 = vandps_avx(auVar76,auVar173);
                    auVar76 = vsubps_avx(auVar73,auVar76);
                    auVar144._8_4_ = 0x3f317218;
                    auVar144._0_8_ = 0x3f3172183f317218;
                    auVar144._12_4_ = 0x3f317218;
                    auVar73 = vfnmadd231ps_fma(auVar51,auVar76,auVar144);
                    fVar40 = auVar73._0_4_;
                    auVar150._0_4_ = fVar40 * fVar40;
                    fVar50 = auVar73._4_4_;
                    auVar150._4_4_ = fVar50 * fVar50;
                    fVar207 = auVar73._8_4_;
                    auVar150._8_4_ = fVar207 * fVar207;
                    fVar6 = auVar73._12_4_;
                    auVar150._12_4_ = fVar6 * fVar6;
                    auVar139._8_4_ = 0x39506967;
                    auVar139._0_8_ = 0x3950696739506967;
                    auVar139._12_4_ = 0x39506967;
                    auVar195._8_4_ = 0x3ab743ce;
                    auVar195._0_8_ = 0x3ab743ce3ab743ce;
                    auVar195._12_4_ = 0x3ab743ce;
                    auVar173 = vfmadd213ps_fma(auVar139,auVar73,auVar195);
                    auVar166._8_4_ = 0x3c088908;
                    auVar166._0_8_ = 0x3c0889083c088908;
                    auVar166._12_4_ = 0x3c088908;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar166);
                    auVar167._8_4_ = 0x3d2aa9c1;
                    auVar167._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar167._12_4_ = 0x3d2aa9c1;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar167);
                    auVar170._8_4_ = 0x3e2aaaaa;
                    auVar170._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar170._12_4_ = 0x3e2aaaaa;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar170);
                    auVar171._8_4_ = 0x3f000000;
                    auVar171._0_8_ = 0x3f0000003f000000;
                    auVar171._12_4_ = 0x3f000000;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar171);
                    auVar52._0_4_ = fVar40 + 1.0;
                    auVar52._4_4_ = fVar50 + 1.0;
                    auVar52._8_4_ = fVar207 + 1.0;
                    auVar52._12_4_ = fVar6 + 1.0;
                    auVar173 = vfmadd231ps_fma(auVar52,auVar150,auVar173);
                    auVar75._0_4_ = (int)auVar76._0_4_;
                    auVar75._4_4_ = (int)auVar76._4_4_;
                    auVar75._8_4_ = (int)auVar76._8_4_;
                    auVar75._12_4_ = (int)auVar76._12_4_;
                    auVar76 = vpslld_avx(auVar75,0x17);
                    auVar151._8_4_ = 0x3f800000;
                    auVar151._0_8_ = 0x3f8000003f800000;
                    auVar151._12_4_ = 0x3f800000;
                    auVar76 = vpaddd_avx(auVar76,auVar151);
                    auVar172._8_4_ = 0x3f800000;
                    auVar172._0_8_ = 0x3f8000003f800000;
                    auVar172._12_4_ = 0x3f800000;
                    auVar74 = vfmadd213ps_fma(auVar76,auVar173,auVar172);
                    auVar53._8_4_ = 0x800000;
                    auVar53._0_8_ = 0x80000000800000;
                    auVar53._12_4_ = 0x800000;
                    auVar76 = vmaxps_avx(auVar74,auVar53);
                    auVar197._8_4_ = 0x807fffff;
                    auVar197._0_8_ = 0x807fffff807fffff;
                    auVar197._12_4_ = 0x807fffff;
                    auVar173 = vpsrld_avx(auVar76,0x17);
                    auVar76 = vandps_avx(auVar197,auVar76);
                    auVar198._8_4_ = 0x3f000000;
                    auVar198._0_8_ = 0x3f0000003f000000;
                    auVar198._12_4_ = 0x3f000000;
                    auVar73 = vorps_avx(auVar198,auVar76);
                    auVar199._8_4_ = 0xffffff82;
                    auVar199._0_8_ = 0xffffff82ffffff82;
                    auVar199._12_4_ = 0xffffff82;
                    auVar51 = vpaddd_avx(auVar173,auVar199);
                    auVar183._8_4_ = 0x3f3504f3;
                    auVar183._0_8_ = 0x3f3504f33f3504f3;
                    auVar183._12_4_ = 0x3f3504f3;
                    auVar173 = vcmpps_avx(auVar73,auVar183,1);
                    auVar76 = vandps_avx(auVar173,auVar73);
                    auVar54._0_4_ = auVar76._0_4_ + auVar73._0_4_ + -1.0;
                    auVar54._4_4_ = auVar76._4_4_ + auVar73._4_4_ + -1.0;
                    auVar54._8_4_ = auVar76._8_4_ + auVar73._8_4_ + -1.0;
                    auVar54._12_4_ = auVar76._12_4_ + auVar73._12_4_ + -1.0;
                    auVar73 = vcmpps_avx(auVar74,(undefined1  [16])0x0,2);
                    auVar51 = vcvtdq2ps_avx(auVar51);
                    auVar184._8_4_ = 0x3f800000;
                    auVar184._0_8_ = 0x3f8000003f800000;
                    auVar184._12_4_ = 0x3f800000;
                    auVar76 = vandps_avx(auVar173,auVar184);
                    auVar76 = vsubps_avx(auVar51,auVar76);
                    auVar185._8_4_ = 0x3d9021bb;
                    auVar185._0_8_ = 0x3d9021bb3d9021bb;
                    auVar185._12_4_ = 0x3d9021bb;
                    auVar100._8_4_ = 0xbdebd1b8;
                    auVar100._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar100._12_4_ = 0xbdebd1b8;
                    auVar173 = vfmadd213ps_fma(auVar185,auVar54,auVar100);
                    auVar101._8_4_ = 0x3def251a;
                    auVar101._0_8_ = 0x3def251a3def251a;
                    auVar101._12_4_ = 0x3def251a;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar54,auVar101);
                    auVar102._8_4_ = 0xbdfe5d4f;
                    auVar102._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar102._12_4_ = 0xbdfe5d4f;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar54,auVar102);
                    auVar103._8_4_ = 0x3e11e9bf;
                    auVar103._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar103._12_4_ = 0x3e11e9bf;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar54,auVar103);
                    auVar104._8_4_ = 0xbe2aae50;
                    auVar104._0_8_ = 0xbe2aae50be2aae50;
                    auVar104._12_4_ = 0xbe2aae50;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar54,auVar104);
                    auVar105._8_4_ = 0x3e4cceac;
                    auVar105._0_8_ = 0x3e4cceac3e4cceac;
                    auVar105._12_4_ = 0x3e4cceac;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar54,auVar105);
                    auVar106._8_4_ = 0xbe7ffffc;
                    auVar106._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar106._12_4_ = 0xbe7ffffc;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar54,auVar106);
                    auVar107._8_4_ = 0x3eaaaaaa;
                    auVar107._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar107._12_4_ = 0x3eaaaaaa;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar54,auVar107);
                    auVar200._8_4_ = 0x3f000000;
                    auVar200._0_8_ = 0x3f0000003f000000;
                    auVar200._12_4_ = 0x3f000000;
                    auVar173 = vfmsub213ps_fma(auVar173,auVar54,auVar200);
                    auVar76 = vfmadd213ps_fma(auVar76,auVar144,auVar54);
                    auVar55._0_4_ = auVar54._0_4_ * auVar54._0_4_;
                    auVar55._4_4_ = auVar54._4_4_ * auVar54._4_4_;
                    auVar55._8_4_ = auVar54._8_4_ * auVar54._8_4_;
                    auVar55._12_4_ = auVar54._12_4_ * auVar54._12_4_;
                    auVar76 = vfmadd231ps_fma(auVar76,auVar55,auVar173);
                    auVar56._0_4_ = auVar76._0_4_ * -2.0;
                    auVar56._4_4_ = auVar76._4_4_ * -2.0;
                    auVar56._8_4_ = auVar76._8_4_ * -2.0;
                    auVar56._12_4_ = auVar76._12_4_ * -2.0;
                    auVar108._8_4_ = 0x7fffffff;
                    auVar108._0_8_ = 0x7fffffff7fffffff;
                    auVar108._12_4_ = 0x7fffffff;
                    auVar76 = vblendvps_avx(auVar56,auVar108,auVar73);
                    auVar77._8_4_ = 0x42b0c0a5;
                    auVar77._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar77._12_4_ = 0x42b0c0a5;
                    auVar76 = vminps_avx(auVar76,auVar77);
                    auVar73 = vmaxps_avx(auVar191,auVar76);
                    auVar109._8_4_ = 0x3f000000;
                    auVar109._0_8_ = 0x3f0000003f000000;
                    auVar109._12_4_ = 0x3f000000;
                    auVar76 = vfmadd213ps_fma(auVar193,auVar73,auVar109);
                    auVar174._0_4_ = (int)auVar76._0_4_;
                    auVar174._4_4_ = (int)auVar76._4_4_;
                    auVar174._8_4_ = (int)auVar76._8_4_;
                    auVar174._12_4_ = (int)auVar76._12_4_;
                    auVar173 = vcvtdq2ps_avx(auVar174);
                    auVar76 = vcmpps_avx(auVar76,auVar173,1);
                    auVar110._8_4_ = 0x3f800000;
                    auVar110._0_8_ = 0x3f8000003f800000;
                    auVar110._12_4_ = 0x3f800000;
                    auVar76 = vandps_avx(auVar76,auVar110);
                    auVar76 = vsubps_avx(auVar173,auVar76);
                    auVar73 = vfnmadd231ps_fma(auVar73,auVar76,auVar144);
                    auVar145._8_4_ = 0x3f800000;
                    auVar145._0_8_ = 0x3f8000003f800000;
                    auVar145._12_4_ = 0x3f800000;
                    auVar148 = ZEXT1664(auVar145);
                    fVar40 = auVar73._0_4_;
                    auVar175._0_4_ = fVar40 * fVar40;
                    fVar50 = auVar73._4_4_;
                    auVar175._4_4_ = fVar50 * fVar50;
                    fVar207 = auVar73._8_4_;
                    auVar175._8_4_ = fVar207 * fVar207;
                    fVar6 = auVar73._12_4_;
                    auVar175._12_4_ = fVar6 * fVar6;
                    auVar140._8_4_ = 0x3f000000;
                    auVar140._0_8_ = 0x3f0000003f000000;
                    auVar140._12_4_ = 0x3f000000;
                    auVar143 = ZEXT1664(auVar140);
                    auVar173 = vfmadd213ps_fma(auVar139,auVar73,auVar195);
                    auVar111._8_4_ = 0x3c088908;
                    auVar111._0_8_ = 0x3c0889083c088908;
                    auVar111._12_4_ = 0x3c088908;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar111);
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar167);
                    auVar112._8_4_ = 0x3e2aaaaa;
                    auVar112._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar112._12_4_ = 0x3e2aaaaa;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar112);
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar140);
                    auVar57._0_4_ = fVar40 + 1.0;
                    auVar57._4_4_ = fVar50 + 1.0;
                    auVar57._8_4_ = fVar207 + 1.0;
                    auVar57._12_4_ = fVar6 + 1.0;
                    auVar173 = vfmadd231ps_fma(auVar57,auVar175,auVar173);
                    auVar78._0_4_ = (int)auVar76._0_4_;
                    auVar78._4_4_ = (int)auVar76._4_4_;
                    auVar78._8_4_ = (int)auVar76._8_4_;
                    auVar78._12_4_ = (int)auVar76._12_4_;
                    auVar76 = vpslld_avx(auVar78,0x17);
                    auVar76 = vpaddd_avx(auVar76,auVar151);
                    auVar173 = vfmadd213ps_fma(auVar76,auVar173,auVar145);
                    auVar76 = vrcpps_avx(auVar173);
                    auVar152._0_4_ = auVar76._0_4_ + auVar76._0_4_;
                    auVar152._4_4_ = auVar76._4_4_ + auVar76._4_4_;
                    auVar152._8_4_ = auVar76._8_4_ + auVar76._8_4_;
                    auVar152._12_4_ = auVar76._12_4_ + auVar76._12_4_;
                    auVar113._8_4_ = 0x40000000;
                    auVar113._0_8_ = 0x4000000040000000;
                    auVar113._12_4_ = 0x40000000;
                    auVar173 = vfmsub213ps_fma(auVar173,auVar152,auVar113);
                    auVar76 = vfnmadd213ps_fma(auVar173,auVar76,auVar152);
                    auVar204 = vfmsub231ps_fma(auVar204,auVar204,auVar76);
                    break;
                  case 5:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var34);
                    auVar76._4_4_ = uVar2;
                    auVar76._0_4_ = uVar2;
                    auVar76._8_4_ = uVar2;
                    auVar76._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var34))[1];
                    auVar84._4_4_ = uVar2;
                    auVar84._0_4_ = uVar2;
                    auVar84._8_4_ = uVar2;
                    auVar84._12_4_ = uVar2;
                    auVar76 = vfmadd231ps_fma(auVar84,auVar204,auVar76);
                    auVar76 = vmaxps_avx(auVar76,(undefined1  [16])0x0);
                    auVar76 = vminps_avx(auVar76,auVar173);
                    auVar204._0_4_ = auVar204._0_4_ * auVar76._0_4_;
                    auVar204._4_4_ = fVar40 * auVar76._4_4_;
                    auVar204._8_4_ = fVar50 * auVar76._8_4_;
                    auVar204._12_4_ = fVar207 * auVar76._12_4_;
                  }
                  auVar76 = auVar143._0_16_;
                  auVar173 = auVar148._0_16_;
                  fVar40 = auVar208._4_4_;
                  fVar50 = auVar208._8_4_;
                  fVar207 = auVar208._12_4_;
                  switch(iVar39) {
                  case 0:
                    auVar208 = vmaxps_avx(auVar208,(undefined1  [16])0x0);
                    break;
                  case 1:
                    auVar76 = vmaxps_avx(auVar208,(undefined1  [16])0x0);
                    auVar173 = vminps_avx(auVar208,(undefined1  [16])0x0);
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var34);
                    auVar209._4_4_ = uVar2;
                    auVar209._0_4_ = uVar2;
                    auVar209._8_4_ = uVar2;
                    auVar209._12_4_ = uVar2;
                    auVar208 = vfmadd213ps_fma(auVar209,auVar173,auVar76);
                    break;
                  case 2:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var34);
                    auVar67._4_4_ = uVar2;
                    auVar67._0_4_ = uVar2;
                    auVar67._8_4_ = uVar2;
                    auVar67._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var34))[1];
                    auVar88._4_4_ = uVar2;
                    auVar88._0_4_ = uVar2;
                    auVar88._8_4_ = uVar2;
                    auVar88._12_4_ = uVar2;
                    auVar76 = vmaxps_avx(auVar208,auVar67);
                    auVar208 = vminps_avx(auVar76,auVar88);
                    break;
                  case 3:
                    auVar68._0_8_ = auVar208._0_8_ ^ 0x8000000080000000;
                    auVar68._8_4_ = -fVar50;
                    auVar68._12_4_ = -fVar207;
                    auVar89._8_4_ = 0x42b0c0a5;
                    auVar89._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar89._12_4_ = 0x42b0c0a5;
                    auVar73 = vminps_avx(auVar68,auVar89);
                    auVar90._8_4_ = 0xc2b0c0a5;
                    auVar90._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar90._12_4_ = 0xc2b0c0a5;
                    auVar51 = vmaxps_avx(auVar73,auVar90);
                    auVar91._8_4_ = 0x3fb8aa3b;
                    auVar91._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar91._12_4_ = 0x3fb8aa3b;
                    auVar73 = vfmadd213ps_fma(auVar91,auVar51,auVar76);
                    auVar160._0_4_ = (int)auVar73._0_4_;
                    auVar160._4_4_ = (int)auVar73._4_4_;
                    auVar160._8_4_ = (int)auVar73._8_4_;
                    auVar160._12_4_ = (int)auVar73._12_4_;
                    auVar208 = vcvtdq2ps_avx(auVar160);
                    auVar73 = vcmpps_avx(auVar73,auVar208,1);
                    auVar73 = vandps_avx(auVar73,auVar173);
                    auVar73 = vsubps_avx(auVar208,auVar73);
                    auVar134._8_4_ = 0xbf317218;
                    auVar134._0_8_ = 0xbf317218bf317218;
                    auVar134._12_4_ = 0xbf317218;
                    auVar51 = vfmadd231ps_fma(auVar51,auVar73,auVar134);
                    fVar40 = auVar51._0_4_;
                    auVar161._0_4_ = fVar40 * fVar40;
                    fVar50 = auVar51._4_4_;
                    auVar161._4_4_ = fVar50 * fVar50;
                    fVar207 = auVar51._8_4_;
                    auVar161._8_4_ = fVar207 * fVar207;
                    fVar6 = auVar51._12_4_;
                    auVar161._12_4_ = fVar6 * fVar6;
                    auVar182._8_4_ = 0x39506967;
                    auVar182._0_8_ = 0x3950696739506967;
                    auVar182._12_4_ = 0x39506967;
                    auVar135._8_4_ = 0x3ab743ce;
                    auVar135._0_8_ = 0x3ab743ce3ab743ce;
                    auVar135._12_4_ = 0x3ab743ce;
                    auVar208 = vfmadd213ps_fma(auVar182,auVar51,auVar135);
                    auVar136._8_4_ = 0x3c088908;
                    auVar136._0_8_ = 0x3c0889083c088908;
                    auVar136._12_4_ = 0x3c088908;
                    auVar208 = vfmadd213ps_fma(auVar208,auVar51,auVar136);
                    auVar137._8_4_ = 0x3d2aa9c1;
                    auVar137._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar137._12_4_ = 0x3d2aa9c1;
                    auVar208 = vfmadd213ps_fma(auVar208,auVar51,auVar137);
                    auVar138._8_4_ = 0x3e2aaaaa;
                    auVar138._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar138._12_4_ = 0x3e2aaaaa;
                    auVar208 = vfmadd213ps_fma(auVar208,auVar51,auVar138);
                    auVar76 = vfmadd213ps_fma(auVar208,auVar51,auVar76);
                    auVar69._0_4_ = fVar40 + auVar148._0_4_;
                    auVar69._4_4_ = fVar50 + auVar148._4_4_;
                    auVar69._8_4_ = fVar207 + auVar148._8_4_;
                    auVar69._12_4_ = fVar6 + auVar148._12_4_;
                    auVar208 = vfmadd231ps_fma(auVar69,auVar161,auVar76);
                    auVar92._0_4_ = (int)auVar73._0_4_;
                    auVar92._4_4_ = (int)auVar73._4_4_;
                    auVar92._8_4_ = (int)auVar73._8_4_;
                    auVar92._12_4_ = (int)auVar73._12_4_;
                    auVar76 = vpslld_avx(auVar92,0x17);
                    auVar162._8_4_ = 0x3f800000;
                    auVar162._0_8_ = 0x3f8000003f800000;
                    auVar162._12_4_ = 0x3f800000;
                    auVar76 = vpaddd_avx(auVar76,auVar162);
                    auVar73 = vfmadd213ps_fma(auVar76,auVar208,auVar173);
                    auVar76 = vrcpps_avx(auVar73);
                    auVar173 = vfmsub213ps_fma(auVar73,auVar76,auVar173);
                    auVar208 = vfnmadd132ps_fma(auVar173,auVar76,auVar76);
                    break;
                  case 4:
                    auVar119._8_4_ = 0x42b0c0a5;
                    auVar119._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar119._12_4_ = 0x42b0c0a5;
                    auVar73 = vminps_avx(auVar208,auVar119);
                    auVar192._8_4_ = 0xc2b0c0a5;
                    auVar192._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar192._12_4_ = 0xc2b0c0a5;
                    auVar51 = vmaxps_avx(auVar192,auVar73);
                    auVar194._8_4_ = 0x3fb8aa3b;
                    auVar194._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar194._12_4_ = 0x3fb8aa3b;
                    auVar76 = vfmadd213ps_fma(auVar194,auVar51,auVar76);
                    auVar156._0_4_ = (int)auVar76._0_4_;
                    auVar156._4_4_ = (int)auVar76._4_4_;
                    auVar156._8_4_ = (int)auVar76._8_4_;
                    auVar156._12_4_ = (int)auVar76._12_4_;
                    auVar73 = vcvtdq2ps_avx(auVar156);
                    auVar76 = vcmpps_avx(auVar76,auVar73,1);
                    auVar76 = vandps_avx(auVar76,auVar173);
                    auVar76 = vsubps_avx(auVar73,auVar76);
                    auVar146._8_4_ = 0x3f317218;
                    auVar146._0_8_ = 0x3f3172183f317218;
                    auVar146._12_4_ = 0x3f317218;
                    auVar73 = vfnmadd231ps_fma(auVar51,auVar76,auVar146);
                    fVar40 = auVar73._0_4_;
                    auVar157._0_4_ = fVar40 * fVar40;
                    fVar50 = auVar73._4_4_;
                    auVar157._4_4_ = fVar50 * fVar50;
                    fVar207 = auVar73._8_4_;
                    auVar157._8_4_ = fVar207 * fVar207;
                    fVar6 = auVar73._12_4_;
                    auVar157._12_4_ = fVar6 * fVar6;
                    auVar141._8_4_ = 0x39506967;
                    auVar141._0_8_ = 0x3950696739506967;
                    auVar141._12_4_ = 0x39506967;
                    auVar196._8_4_ = 0x3ab743ce;
                    auVar196._0_8_ = 0x3ab743ce3ab743ce;
                    auVar196._12_4_ = 0x3ab743ce;
                    auVar173 = vfmadd213ps_fma(auVar141,auVar73,auVar196);
                    auVar168._8_4_ = 0x3c088908;
                    auVar168._0_8_ = 0x3c0889083c088908;
                    auVar168._12_4_ = 0x3c088908;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar168);
                    auVar169._8_4_ = 0x3d2aa9c1;
                    auVar169._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar169._12_4_ = 0x3d2aa9c1;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar169);
                    auVar186._8_4_ = 0x3e2aaaaa;
                    auVar186._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar186._12_4_ = 0x3e2aaaaa;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar186);
                    auVar187._8_4_ = 0x3f000000;
                    auVar187._0_8_ = 0x3f0000003f000000;
                    auVar187._12_4_ = 0x3f000000;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar187);
                    auVar61._0_4_ = fVar40 + 1.0;
                    auVar61._4_4_ = fVar50 + 1.0;
                    auVar61._8_4_ = fVar207 + 1.0;
                    auVar61._12_4_ = fVar6 + 1.0;
                    auVar173 = vfmadd231ps_fma(auVar61,auVar157,auVar173);
                    auVar85._0_4_ = (int)auVar76._0_4_;
                    auVar85._4_4_ = (int)auVar76._4_4_;
                    auVar85._8_4_ = (int)auVar76._8_4_;
                    auVar85._12_4_ = (int)auVar76._12_4_;
                    auVar76 = vpslld_avx(auVar85,0x17);
                    auVar158._8_4_ = 0x3f800000;
                    auVar158._0_8_ = 0x3f8000003f800000;
                    auVar158._12_4_ = 0x3f800000;
                    auVar76 = vpaddd_avx(auVar76,auVar158);
                    auVar176._8_4_ = 0x3f800000;
                    auVar176._0_8_ = 0x3f8000003f800000;
                    auVar176._12_4_ = 0x3f800000;
                    auVar74 = vfmadd213ps_fma(auVar76,auVar173,auVar176);
                    auVar62._8_4_ = 0x800000;
                    auVar62._0_8_ = 0x80000000800000;
                    auVar62._12_4_ = 0x800000;
                    auVar76 = vmaxps_avx(auVar74,auVar62);
                    auVar177._8_4_ = 0x807fffff;
                    auVar177._0_8_ = 0x807fffff807fffff;
                    auVar177._12_4_ = 0x807fffff;
                    auVar173 = vpsrld_avx(auVar76,0x17);
                    auVar76 = vandps_avx(auVar177,auVar76);
                    auVar178._8_4_ = 0x3f000000;
                    auVar178._0_8_ = 0x3f0000003f000000;
                    auVar178._12_4_ = 0x3f000000;
                    auVar73 = vorps_avx(auVar178,auVar76);
                    auVar179._8_4_ = 0xffffff82;
                    auVar179._0_8_ = 0xffffff82ffffff82;
                    auVar179._12_4_ = 0xffffff82;
                    auVar51 = vpaddd_avx(auVar173,auVar179);
                    auVar188._8_4_ = 0x3f3504f3;
                    auVar188._0_8_ = 0x3f3504f33f3504f3;
                    auVar188._12_4_ = 0x3f3504f3;
                    auVar173 = vcmpps_avx(auVar73,auVar188,1);
                    auVar76 = vandps_avx(auVar173,auVar73);
                    auVar63._0_4_ = auVar76._0_4_ + auVar73._0_4_ + -1.0;
                    auVar63._4_4_ = auVar76._4_4_ + auVar73._4_4_ + -1.0;
                    auVar63._8_4_ = auVar76._8_4_ + auVar73._8_4_ + -1.0;
                    auVar63._12_4_ = auVar76._12_4_ + auVar73._12_4_ + -1.0;
                    auVar73 = vcmpps_avx(auVar74,(undefined1  [16])0x0,2);
                    auVar51 = vcvtdq2ps_avx(auVar51);
                    auVar202._8_4_ = 0x3f800000;
                    auVar202._0_8_ = 0x3f8000003f800000;
                    auVar202._12_4_ = 0x3f800000;
                    auVar76 = vandps_avx(auVar173,auVar202);
                    auVar76 = vsubps_avx(auVar51,auVar76);
                    auVar189._8_4_ = 0x3d9021bb;
                    auVar189._0_8_ = 0x3d9021bb3d9021bb;
                    auVar189._12_4_ = 0x3d9021bb;
                    auVar120._8_4_ = 0xbdebd1b8;
                    auVar120._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar120._12_4_ = 0xbdebd1b8;
                    auVar173 = vfmadd213ps_fma(auVar189,auVar63,auVar120);
                    auVar121._8_4_ = 0x3def251a;
                    auVar121._0_8_ = 0x3def251a3def251a;
                    auVar121._12_4_ = 0x3def251a;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar63,auVar121);
                    auVar122._8_4_ = 0xbdfe5d4f;
                    auVar122._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar122._12_4_ = 0xbdfe5d4f;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar63,auVar122);
                    auVar123._8_4_ = 0x3e11e9bf;
                    auVar123._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar123._12_4_ = 0x3e11e9bf;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar63,auVar123);
                    auVar124._8_4_ = 0xbe2aae50;
                    auVar124._0_8_ = 0xbe2aae50be2aae50;
                    auVar124._12_4_ = 0xbe2aae50;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar63,auVar124);
                    auVar125._8_4_ = 0x3e4cceac;
                    auVar125._0_8_ = 0x3e4cceac3e4cceac;
                    auVar125._12_4_ = 0x3e4cceac;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar63,auVar125);
                    auVar126._8_4_ = 0xbe7ffffc;
                    auVar126._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar126._12_4_ = 0xbe7ffffc;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar63,auVar126);
                    auVar127._8_4_ = 0x3eaaaaaa;
                    auVar127._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar127._12_4_ = 0x3eaaaaaa;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar63,auVar127);
                    auVar203._8_4_ = 0x3f000000;
                    auVar203._0_8_ = 0x3f0000003f000000;
                    auVar203._12_4_ = 0x3f000000;
                    auVar173 = vfmsub213ps_fma(auVar173,auVar63,auVar203);
                    auVar76 = vfmadd213ps_fma(auVar76,auVar146,auVar63);
                    auVar64._0_4_ = auVar63._0_4_ * auVar63._0_4_;
                    auVar64._4_4_ = auVar63._4_4_ * auVar63._4_4_;
                    auVar64._8_4_ = auVar63._8_4_ * auVar63._8_4_;
                    auVar64._12_4_ = auVar63._12_4_ * auVar63._12_4_;
                    auVar76 = vfmadd231ps_fma(auVar76,auVar64,auVar173);
                    auVar65._0_4_ = auVar76._0_4_ * -2.0;
                    auVar65._4_4_ = auVar76._4_4_ * -2.0;
                    auVar65._8_4_ = auVar76._8_4_ * -2.0;
                    auVar65._12_4_ = auVar76._12_4_ * -2.0;
                    auVar128._8_4_ = 0x7fffffff;
                    auVar128._0_8_ = 0x7fffffff7fffffff;
                    auVar128._12_4_ = 0x7fffffff;
                    auVar76 = vblendvps_avx(auVar65,auVar128,auVar73);
                    auVar86._8_4_ = 0x42b0c0a5;
                    auVar86._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar86._12_4_ = 0x42b0c0a5;
                    auVar76 = vminps_avx(auVar76,auVar86);
                    auVar73 = vmaxps_avx(auVar192,auVar76);
                    auVar129._8_4_ = 0x3f000000;
                    auVar129._0_8_ = 0x3f0000003f000000;
                    auVar129._12_4_ = 0x3f000000;
                    auVar76 = vfmadd213ps_fma(auVar194,auVar73,auVar129);
                    auVar180._0_4_ = (int)auVar76._0_4_;
                    auVar180._4_4_ = (int)auVar76._4_4_;
                    auVar180._8_4_ = (int)auVar76._8_4_;
                    auVar180._12_4_ = (int)auVar76._12_4_;
                    auVar173 = vcvtdq2ps_avx(auVar180);
                    auVar76 = vcmpps_avx(auVar76,auVar173,1);
                    auVar130._8_4_ = 0x3f800000;
                    auVar130._0_8_ = 0x3f8000003f800000;
                    auVar130._12_4_ = 0x3f800000;
                    auVar76 = vandps_avx(auVar76,auVar130);
                    auVar76 = vsubps_avx(auVar173,auVar76);
                    auVar73 = vfnmadd231ps_fma(auVar73,auVar76,auVar146);
                    auVar147._8_4_ = 0x3f800000;
                    auVar147._0_8_ = 0x3f8000003f800000;
                    auVar147._12_4_ = 0x3f800000;
                    auVar148 = ZEXT1664(auVar147);
                    fVar40 = auVar73._0_4_;
                    auVar181._0_4_ = fVar40 * fVar40;
                    fVar50 = auVar73._4_4_;
                    auVar181._4_4_ = fVar50 * fVar50;
                    fVar207 = auVar73._8_4_;
                    auVar181._8_4_ = fVar207 * fVar207;
                    fVar6 = auVar73._12_4_;
                    auVar181._12_4_ = fVar6 * fVar6;
                    auVar142._8_4_ = 0x3f000000;
                    auVar142._0_8_ = 0x3f0000003f000000;
                    auVar142._12_4_ = 0x3f000000;
                    auVar143 = ZEXT1664(auVar142);
                    auVar173 = vfmadd213ps_fma(auVar141,auVar73,auVar196);
                    auVar131._8_4_ = 0x3c088908;
                    auVar131._0_8_ = 0x3c0889083c088908;
                    auVar131._12_4_ = 0x3c088908;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar131);
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar169);
                    auVar132._8_4_ = 0x3e2aaaaa;
                    auVar132._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar132._12_4_ = 0x3e2aaaaa;
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar132);
                    auVar173 = vfmadd213ps_fma(auVar173,auVar73,auVar142);
                    auVar66._0_4_ = fVar40 + 1.0;
                    auVar66._4_4_ = fVar50 + 1.0;
                    auVar66._8_4_ = fVar207 + 1.0;
                    auVar66._12_4_ = fVar6 + 1.0;
                    auVar173 = vfmadd231ps_fma(auVar66,auVar181,auVar173);
                    auVar87._0_4_ = (int)auVar76._0_4_;
                    auVar87._4_4_ = (int)auVar76._4_4_;
                    auVar87._8_4_ = (int)auVar76._8_4_;
                    auVar87._12_4_ = (int)auVar76._12_4_;
                    auVar76 = vpslld_avx(auVar87,0x17);
                    auVar76 = vpaddd_avx(auVar76,auVar158);
                    auVar173 = vfmadd213ps_fma(auVar76,auVar173,auVar147);
                    auVar76 = vrcpps_avx(auVar173);
                    auVar159._0_4_ = auVar76._0_4_ + auVar76._0_4_;
                    auVar159._4_4_ = auVar76._4_4_ + auVar76._4_4_;
                    auVar159._8_4_ = auVar76._8_4_ + auVar76._8_4_;
                    auVar159._12_4_ = auVar76._12_4_ + auVar76._12_4_;
                    auVar133._8_4_ = 0x40000000;
                    auVar133._0_8_ = 0x4000000040000000;
                    auVar133._12_4_ = 0x40000000;
                    auVar173 = vfmsub213ps_fma(auVar173,auVar159,auVar133);
                    auVar76 = vfnmadd213ps_fma(auVar173,auVar76,auVar159);
                    auVar208 = vfmsub231ps_fma(auVar208,auVar208,auVar76);
                    break;
                  case 5:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var34);
                    auVar70._4_4_ = uVar2;
                    auVar70._0_4_ = uVar2;
                    auVar70._8_4_ = uVar2;
                    auVar70._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var34))[1];
                    auVar93._4_4_ = uVar2;
                    auVar93._0_4_ = uVar2;
                    auVar93._8_4_ = uVar2;
                    auVar93._12_4_ = uVar2;
                    auVar76 = vfmadd231ps_fma(auVar93,auVar208,auVar70);
                    auVar76 = vmaxps_avx(auVar76,(undefined1  [16])0x0);
                    auVar76 = vminps_avx(auVar76,auVar173);
                    auVar208._0_4_ = auVar208._0_4_ * auVar76._0_4_;
                    auVar208._4_4_ = fVar40 * auVar76._4_4_;
                    auVar208._8_4_ = fVar50 * auVar76._8_4_;
                    auVar208._12_4_ = fVar207 * auVar76._12_4_;
                  }
                  if (iVar45 < 0x65) {
                    *pauVar46 = auVar204;
                    pauVar46[1] = auVar208;
                    pauVar46 = pauVar46 + 2;
                  }
                  else {
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var34) +
                                      local_2d8 * 0x20);
                    auVar71._0_4_ = auVar204._0_4_ * *pfVar1;
                    auVar71._4_4_ = auVar204._4_4_ * pfVar1[1];
                    auVar71._8_4_ = auVar204._8_4_ * pfVar1[2];
                    auVar71._12_4_ = auVar204._12_4_ * pfVar1[3];
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var34) + 0x10 +
                                      local_2d8 * 0x20);
                    auVar94._0_4_ = auVar208._0_4_ * *pfVar1;
                    auVar94._4_4_ = auVar208._4_4_ * pfVar1[1];
                    auVar94._8_4_ = auVar208._8_4_ * pfVar1[2];
                    auVar94._12_4_ = auVar208._12_4_ * pfVar1[3];
                    auVar163._8_4_ = 0x80000000;
                    auVar163._0_8_ = 0x8000000080000000;
                    auVar163._12_4_ = 0x80000000;
                    auVar76 = vandps_avx(auVar71,auVar163);
                    auVar173 = vandps_avx(auVar94,auVar163);
                    auVar190._8_4_ = 0x3f000000;
                    auVar190._0_8_ = 0x3f0000003f000000;
                    auVar190._12_4_ = 0x3f000000;
                    auVar76 = vorps_avx(auVar76,auVar190);
                    auVar173 = vorps_avx(auVar190,auVar173);
                    auVar72._0_4_ = (int)(auVar76._0_4_ + auVar71._0_4_);
                    auVar72._4_4_ = (int)(auVar76._4_4_ + auVar71._4_4_);
                    auVar72._8_4_ = (int)(auVar76._8_4_ + auVar71._8_4_);
                    auVar72._12_4_ = (int)(auVar76._12_4_ + auVar71._12_4_);
                    auVar95._0_4_ = (int)(auVar94._0_4_ + auVar173._0_4_);
                    auVar95._4_4_ = (int)(auVar94._4_4_ + auVar173._4_4_);
                    auVar95._8_4_ = (int)(auVar94._8_4_ + auVar173._8_4_);
                    auVar95._12_4_ = (int)(auVar94._12_4_ + auVar173._12_4_);
                    auVar164._8_2_ = 0x7f;
                    auVar164._0_8_ = 0x7f007f007f007f;
                    auVar164._10_2_ = 0x7f;
                    auVar164._12_2_ = 0x7f;
                    auVar164._14_2_ = 0x7f;
                    auVar76 = vpackssdw_avx(auVar72,auVar95);
                    auVar76 = vpminsw_avx(auVar76,auVar164);
                    auVar96._8_2_ = 0xff81;
                    auVar96._0_8_ = 0xff81ff81ff81ff81;
                    auVar96._10_2_ = 0xff81;
                    auVar96._12_2_ = 0xff81;
                    auVar96._14_2_ = 0xff81;
                    auVar76 = vpmaxsw_avx(auVar76,auVar96);
                    auVar76 = vpacksswb_avx(auVar76,auVar76);
                    *(long *)*pauVar47 = auVar76._0_8_;
                    pauVar47 = (undefined1 (*) [16])((long)*pauVar47 + 8);
                  }
                  bVar49 = iVar30 != iVar28;
                  iVar30 = iVar30 + 1;
                } while (bVar49);
              }
              uVar48 = (ulong)(iVar38 + 1);
            } while (iVar38 != (int)local_250);
          }
          local_2d8 = local_2d8 + 1;
          local_2b0 = (pointer)(ulong)(uint)((int)local_2b0 + iVar43);
        } while (local_2d8 != local_158._0_8_);
      }
      local_2c8 = top_blob;
      if ((pointer)local_338._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_338._0_8_,local_338._16_8_ - local_338._0_8_);
      }
      iVar30 = 0;
      opt = (Option *)local_2a8._0_8_;
      top_blob = local_2c8;
      local_338._8_8_ = (Allocator *)CONCAT44(local_338._12_4_,local_338._8_4_);
      if ((int)local_2b8 != 1) goto LAB_0029a0fa;
    }
    p_Var34 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
    iVar43 = *(int *)(&this->field_0xd4 + (long)p_Var34);
    if ((long)iVar43 == 3) {
      if (((((*(int *)(&this->field_0xd8 + (long)p_Var34) == 3) &&
            (*(int *)(&this->field_0xe4 + (long)p_Var34) == 1)) &&
           (*(int *)(&this->field_0xe8 + (long)p_Var34) == 1)) &&
          ((*(int *)(&this->field_0xdc + (long)p_Var34) == 1 &&
           (*(int *)(&this->field_0xe0 + (long)p_Var34) == 1)))) &&
         (*(uint *)(&this->field_0x110 + (long)p_Var34) < 2)) {
        local_2a8._0_8_ = opt;
        if (iVar45 < 0x65) {
          local_338._0_8_ = (pointer)0x0;
          local_338._8_8_ = (Allocator *)0x0;
          local_338._16_8_ = (Allocator *)0x0;
          p_Var34 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 +
                    (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
          if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3])
             ) {
            lVar33 = 0;
            local_338._8_8_ = (float *)0x0;
            do {
              local_298._0_4_ =
                   1.0 / (*(float *)(*(long *)(p_Var34 + 0x1f8) + lVar33 * 4) *
                         *(float *)(*(long *)(p_Var34 + 0x240) + lVar33 * 4));
              if (local_338._8_8_ == local_338._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_338,
                           (iterator)local_338._8_8_,(float *)local_298);
              }
              else {
                *(undefined4 *)local_338._8_8_ = local_298._0_4_;
                local_338._8_8_ = local_338._8_8_ + 4;
              }
              lVar33 = lVar33 + 1;
              p_Var34 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 +
                        (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
            } while (lVar33 < *(int *)(&this->field_0x108 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_a8,(vector<float,_std::allocator<float>_> *)local_338);
          convdw3x3s1_int8_dequant_sse
                    (&local_248,top_blob,(Mat *)(p_Var34 + 0x168),(Mat *)(p_Var34 + 0x1b0),&local_a8
                     ,opt_00);
        }
        else {
          local_338._0_8_ = (pointer)0x0;
          local_338._8_8_ = (Allocator *)0x0;
          local_338._16_8_ = (Allocator *)0x0;
          p_Var34 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 +
                    (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
          if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3])
             ) {
            lVar33 = 0;
            local_338._8_8_ = (float *)0x0;
            do {
              fVar40 = *(float *)(*(long *)(p_Var34 + 0x1f8) + lVar33 * 4);
              local_298._0_4_ = 0.0;
              if (fVar40 != 0.0) {
                local_298._0_4_ =
                     1.0 / (fVar40 * *(float *)(*(long *)(p_Var34 + 0x240) + lVar33 * 4));
              }
              local_1f8._0_4_ = *(float *)(*(long *)(p_Var34 + 0x288) + lVar33 * 4);
              if (local_338._8_8_ == local_338._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_338,
                           (iterator)local_338._8_8_,(float *)local_298);
              }
              else {
                *(undefined4 *)local_338._8_8_ = local_298._0_4_;
                local_338._8_8_ = local_338._8_8_ + 4;
              }
              if (local_338._8_8_ == local_338._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_338,
                           (iterator)local_338._8_8_,(float *)&local_1f8);
              }
              else {
                *(float *)local_338._8_8_ = (float)local_1f8;
                local_338._8_8_ = local_338._8_8_ + 4;
              }
              lVar33 = lVar33 + 1;
              p_Var34 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 +
                        (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
            } while (lVar33 < *(int *)(&this->field_0x108 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_90,(vector<float,_std::allocator<float>_> *)local_338);
          convdw3x3s1_int8_requant_sse
                    (&local_248,top_blob,(Mat *)(p_Var34 + 0x168),(Mat *)(p_Var34 + 0x1b0),&local_90
                     ,opt_00);
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_338._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_338._0_8_,local_338._16_8_ - local_338._0_8_);
        }
        pLVar5 = this->activation;
      }
      else {
        if ((((iVar43 != 3) || (*(int *)(&this->field_0xd8 + (long)p_Var34) != 3)) ||
            ((*(int *)(&this->field_0xdc + (long)p_Var34) != 1 ||
             (((*(int *)(&this->field_0xe0 + (long)p_Var34) != 1 ||
               (*(int *)(&this->field_0xe4 + (long)p_Var34) != 2)) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var34) != 2)))))) ||
           (1 < *(uint *)(&this->field_0x110 + (long)p_Var34))) goto LAB_00299aa2;
        local_2a8._0_8_ = opt;
        if (iVar45 < 0x65) {
          local_338._0_8_ = (pointer)0x0;
          local_338._8_8_ = (Allocator *)0x0;
          local_338._16_8_ = (Allocator *)0x0;
          p_Var34 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 +
                    (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
          if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3])
             ) {
            lVar33 = 0;
            local_338._8_8_ = (float *)0x0;
            do {
              local_298._0_4_ =
                   1.0 / (*(float *)(*(long *)(p_Var34 + 0x1f8) + lVar33 * 4) *
                         *(float *)(*(long *)(p_Var34 + 0x240) + lVar33 * 4));
              if (local_338._8_8_ == local_338._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_338,
                           (iterator)local_338._8_8_,(float *)local_298);
              }
              else {
                *(undefined4 *)local_338._8_8_ = local_298._0_4_;
                local_338._8_8_ = local_338._8_8_ + 4;
              }
              lVar33 = lVar33 + 1;
              p_Var34 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 +
                        (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
            } while (lVar33 < *(int *)(&this->field_0x108 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_d8,(vector<float,_std::allocator<float>_> *)local_338);
          convdw3x3s2_int8_dequant_sse
                    (&local_248,top_blob,(Mat *)(p_Var34 + 0x168),(Mat *)(p_Var34 + 0x1b0),&local_d8
                     ,opt_00);
        }
        else {
          local_338._0_8_ = (pointer)0x0;
          local_338._8_8_ = (Allocator *)0x0;
          local_338._16_8_ = (Allocator *)0x0;
          p_Var34 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 +
                    (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
          if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3])
             ) {
            lVar33 = 0;
            local_338._8_8_ = (float *)0x0;
            do {
              fVar40 = *(float *)(*(long *)(p_Var34 + 0x1f8) + lVar33 * 4);
              local_298._0_4_ = 0.0;
              if (fVar40 != 0.0) {
                local_298._0_4_ =
                     1.0 / (fVar40 * *(float *)(*(long *)(p_Var34 + 0x240) + lVar33 * 4));
              }
              local_1f8._0_4_ = *(float *)(*(long *)(p_Var34 + 0x288) + lVar33 * 4);
              if (local_338._8_8_ == local_338._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_338,
                           (iterator)local_338._8_8_,(float *)local_298);
              }
              else {
                *(undefined4 *)local_338._8_8_ = local_298._0_4_;
                local_338._8_8_ = local_338._8_8_ + 4;
              }
              if (local_338._8_8_ == local_338._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_338,
                           (iterator)local_338._8_8_,(float *)&local_1f8);
              }
              else {
                *(float *)local_338._8_8_ = (float)local_1f8;
                local_338._8_8_ = local_338._8_8_ + 4;
              }
              lVar33 = lVar33 + 1;
              p_Var34 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 +
                        (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
            } while (lVar33 < *(int *)(&this->field_0x108 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_c0,(vector<float,_std::allocator<float>_> *)local_338);
          convdw3x3s2_int8_requant_sse
                    (&local_248,top_blob,(Mat *)(p_Var34 + 0x168),(Mat *)(p_Var34 + 0x1b0),&local_c0
                     ,opt_00);
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_338._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_338._0_8_,local_338._16_8_ - local_338._0_8_);
        }
        pLVar5 = this->activation;
      }
      if (pLVar5 != (Layer *)0x0) {
        (*pLVar5->_vptr_Layer[9])(pLVar5,top_blob,local_2a8._0_8_);
        iVar30 = 0;
        goto LAB_0029a0fa;
      }
    }
    else {
LAB_00299aa2:
      local_2d8 = (long)*(int *)(&this->field_0xd8 + (long)p_Var34) * (long)iVar43;
      local_2c8 = top_blob;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_338,local_2d8,
                 (allocator_type *)local_298);
      uVar15 = local_338._0_8_;
      pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx2;
      p_Var34 = pp_Var42[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var34)) {
        iVar43 = *(int *)(&this->field_0xe0 + (long)p_Var34);
        iVar38 = *(int *)(&this->field_0xdc + (long)p_Var34);
        iVar30 = *(int *)(&this->field_0xd4 + (long)p_Var34);
        iVar39 = 0;
        fVar40 = 0.0;
        iVar41 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var42[-3])) {
            lVar33 = 0;
            do {
              *(float *)(local_338._0_8_ + (iVar41 + lVar33) * 4) = fVar40;
              fVar40 = (float)((int)fVar40 + *(int *)(&this->field_0xdc + (long)pp_Var42[-3]));
              lVar33 = lVar33 + 1;
            } while ((int)lVar33 < *(int *)(&this->field_0xd4 + (long)pp_Var42[-3]));
            iVar41 = iVar41 + (int)lVar33;
          }
          fVar40 = (float)((int)fVar40 + ((int)local_2c0 * iVar43 - iVar38 * iVar30));
          iVar39 = iVar39 + 1;
        } while (iVar39 < *(int *)(&this->field_0xd8 + (long)pp_Var42[-3]));
      }
      if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3])) {
        local_130 = (long)(int)local_2d8;
        pp_Var42 = this->_vptr_ConvolutionDepthWise_x86_avx2;
        uVar48 = local_2d8 & 0xffffffff;
        local_158._8_4_ = 0x80000000;
        local_158._0_8_ = 0x8000000080000000;
        local_158._12_4_ = 0x80000000;
        auVar143 = ZEXT1664(local_158);
        local_2a8._8_4_ = 0x3effffff;
        local_2a8._0_8_ = 0x3effffff3effffff;
        local_2a8._12_4_ = 0x3effffff;
        local_1b0 = 0;
        lVar33 = 0;
        uVar35 = local_2d8;
        local_2b8 = pp_Var42;
        do {
          if (-1 < (int)local_250) {
            pfVar44 = (pointer)(local_248.cstep * lVar33 * local_248.elemsize + (long)local_248.data
                               );
            local_2e8 = (float *)(local_2c8->cstep * lVar33 * local_2c8->elemsize +
                                 (long)local_2c8->data);
            local_2d0 = (long)local_248.w * local_248.elemsize;
            lVar36 = *(long *)(&this->field_0x168 + (long)pp_Var42[-3]) + local_1b0;
            local_2c0 = 0;
            local_2e0 = local_2e8;
            local_2b0 = pfVar44;
            do {
              if (-1 < iVar28) {
                lVar29 = (long)(int)local_2c0;
                iVar43 = 0;
                do {
                  p_Var34 = pp_Var42[-3];
                  fVar40 = 0.0;
                  fVar50 = 0.0;
                  if (0 < (int)uVar35) {
                    uVar32 = 0;
                    iVar38 = 0;
                    do {
                      iVar38 = iVar38 + (int)*(char *)(lVar36 + uVar32) *
                                        (int)*(char *)((long)pfVar44 +
                                                      (long)(int)*(pointer)(uVar15 + uVar32 * 4) +
                                                      *(int *)(&this->field_0xe8 + (long)p_Var34) *
                                                      lVar29 * local_2d0 +
                                                      (long)iVar43 *
                                                      (long)*(int *)(&this->field_0xe4 +
                                                                    (long)p_Var34));
                      uVar32 = uVar32 + 1;
                    } while (uVar48 != uVar32);
                    fVar50 = (float)iVar38;
                  }
                  fVar207 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var34) + lVar33 * 4);
                  if (fVar207 != 0.0) {
                    fVar40 = 1.0 / (fVar207 *
                                   *(float *)(*(long *)(&this->field_0x240 + (long)p_Var34) +
                                             lVar33 * 4));
                  }
                  fVar40 = fVar40 * fVar50;
                  if (*(int *)(&this->field_0x100 + (long)p_Var34) != 0) {
                    fVar40 = fVar40 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var34) +
                                                lVar33 * 4);
                  }
                  auVar76 = ZEXT416((uint)fVar40);
                  fVar50 = fVar40;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var34)) {
                  case 1:
                    auVar76 = vmaxss_avx(auVar76,ZEXT416(0));
                    fVar50 = auVar76._0_4_;
                    break;
                  case 2:
                    auVar76 = vcmpss_avx(ZEXT816(0) << 0x20,auVar76,1);
                    auVar97._8_4_ = 0x3f800000;
                    auVar97._0_8_ = 0x3f8000003f800000;
                    auVar97._12_4_ = 0x3f800000;
                    auVar76 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var34))
                                            ,auVar97,auVar76);
                    fVar50 = auVar76._0_4_ * fVar40;
                    break;
                  case 3:
                    auVar76 = vmaxss_avx(auVar76,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                    (long)p_Var34)));
                    auVar76 = vminss_avx(auVar76,ZEXT416((*(uint **)(&this->field_0x118 +
                                                                    (long)p_Var34))[1]));
                    fVar50 = auVar76._0_4_;
                    break;
                  case 4:
                    fVar40 = expf((float)((uint)fVar40 ^ auVar143._0_4_));
                    auVar143 = ZEXT1664(local_158);
                    uVar35 = local_2d8;
                    pp_Var42 = local_2b8;
                    pfVar44 = local_2b0;
                    fVar50 = 1.0 / (fVar40 + 1.0);
                    break;
                  case 5:
                    local_148 = auVar76;
                    fVar40 = expf(fVar40);
                    fVar40 = logf(fVar40 + 1.0);
                    fVar40 = tanhf(fVar40);
                    auVar143 = ZEXT1664(local_158);
                    uVar35 = local_2d8;
                    pp_Var42 = local_2b8;
                    pfVar44 = local_2b0;
                    fVar50 = fVar40 * (float)local_148._0_4_;
                    break;
                  case 6:
                    fVar207 = **(float **)(&this->field_0x118 + (long)p_Var34);
                    fVar6 = (*(float **)(&this->field_0x118 + (long)p_Var34))[1];
                    fVar98 = (float)((uint)fVar6 ^ auVar143._0_4_) / fVar207;
                    fVar50 = 0.0;
                    if ((fVar98 <= fVar40) && (fVar50 = fVar40, fVar40 <= fVar98 + 1.0 / fVar207)) {
                      auVar76 = vfmadd213ss_fma(ZEXT416((uint)fVar207),auVar76,ZEXT416((uint)fVar6))
                      ;
                      fVar50 = auVar76._0_4_ * fVar40;
                    }
                  }
                  if (iVar45 < 0x65) {
                    *local_2e0 = fVar50;
                    local_2e0 = local_2e0 + 1;
                  }
                  else {
                    fVar50 = fVar50 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var34) +
                                                lVar33 * 4);
                    auVar76 = vandps_avx(ZEXT416((uint)fVar50),auVar143._0_16_);
                    auVar76 = vorps_avx(auVar76,local_2a8);
                    auVar76 = ZEXT416((uint)(fVar50 + auVar76._0_4_));
                    auVar76 = vroundss_avx(auVar76,auVar76,0xb);
                    iVar38 = (int)auVar76._0_4_;
                    if (iVar38 < -0x7e) {
                      iVar38 = -0x7f;
                    }
                    uVar25 = (undefined1)iVar38;
                    if (0x7e < iVar38) {
                      uVar25 = 0x7f;
                    }
                    *(undefined1 *)local_2e8 = uVar25;
                    local_2e8 = (float *)((long)local_2e8 + 1);
                  }
                  bVar49 = iVar43 != iVar28;
                  iVar43 = iVar43 + 1;
                } while (bVar49);
              }
              iVar43 = (int)local_2c0;
              local_2c0 = (ulong)(iVar43 + 1);
            } while (iVar43 != (int)local_250);
          }
          lVar33 = lVar33 + 1;
          local_1b0 = local_1b0 + local_130;
        } while (lVar33 < *(int *)(&this->field_0x108 + (long)pp_Var42[-3]));
      }
      if ((pointer)local_338._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_338._0_8_,local_338._16_8_ - local_338._0_8_);
      }
    }
    iVar30 = 0;
    goto LAB_0029a0fa;
  }
  local_2d0 = 1;
  if (opt->use_packing_layout == true) {
    local_2d0 = (ulong)((uint)(((&this->field_0xd0)[(long)p_Var34] & 3) == 0) * 3 + 1);
  }
  iVar28 = (int)local_2d0;
  uVar35 = (ulong)(uint)(iVar28 * 4);
  if (100 < *(int *)(&this->field_0x10c + (long)p_Var34)) {
    uVar35 = local_2d0;
  }
  local_158 = auVar76;
  Mat::create(top_blob,iVar38,iVar43,*(int *)(&this->field_0xd0 + (long)p_Var34) / iVar28,uVar35,
              iVar28,opt->blob_allocator);
  auVar24 = local_318;
  iVar30 = -100;
  local_338._8_8_ = (Allocator *)CONCAT44(local_338._12_4_,local_338._8_4_);
  if ((top_blob->data == (void *)0x0) ||
     (local_338._8_8_ = (Allocator *)CONCAT44(local_338._12_4_,local_338._8_4_),
     (long)top_blob->c * top_blob->cstep == 0)) goto LAB_0029a0fa;
  uVar37 = (int)uVar37 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
  local_2e0 = (float *)CONCAT44(local_2e0._4_4_,uVar37);
  uVar26 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
  local_2e8 = (float *)CONCAT44(local_2e8._4_4_,uVar26);
  local_354 = 1;
  uVar27 = 1;
  if (opt->use_packing_layout == true) {
    local_354 = 1;
    if ((uVar37 & 7) == 0) {
      local_354 = 8;
    }
    uVar27 = (uint)((uVar26 & 3) == 0) * 3 + 1;
  }
  piVar3 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  local_338._0_8_ = local_248.data;
  local_338._8_4_ = local_248.refcount._0_4_;
  local_338._12_4_ = local_248.refcount._4_4_;
  local_338._16_8_ = local_248.elemsize;
  local_338._24_4_ = local_248.elempack;
  local_318._12_4_ = local_248.w;
  local_318._8_4_ = local_248.dims;
  local_318._20_4_ = local_248.d;
  local_318._16_4_ = local_248.h;
  local_318._0_8_ = local_248.allocator;
  local_318._28_4_ = auVar24._28_4_;
  local_318._24_4_ = local_248.c;
  local_2f8 = local_248.cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (local_354 < (int)local_2b8) {
    uVar15._0_1_ = opt->lightmode;
    uVar15._1_3_ = *(undefined3 *)&opt->field_0x1;
    uVar15._4_4_ = opt->num_threads;
    local_298._16_8_ = opt->workspace_allocator;
    uVar16 = opt->openmp_blocktime;
    uVar17 = opt->use_winograd_convolution;
    uVar19 = opt->use_sgemm_convolution;
    uVar21 = opt->use_int8_inference;
    uVar23 = opt->use_vulkan_compute;
    uVar22 = CONCAT11(uVar23,uVar21);
    uVar20 = CONCAT21(uVar22,uVar19);
    uVar18 = CONCAT31(uVar20,uVar17);
    local_298._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
    auStack_270[0] = opt->use_shader_pack8;
    auStack_270[1] = opt->use_subgroup_basic;
    auStack_270[2] = opt->use_subgroup_vote;
    auStack_270[3] = opt->use_subgroup_ballot;
    auStack_270[4] = opt->use_subgroup_shuffle;
    auStack_270[5] = opt->use_image_storage;
    auStack_270[6] = opt->use_tensor_storage;
    auStack_270[7] = opt->use_weight_fp16_storage;
    auStack_270._8_4_ = opt->flush_denormals;
    auStack_270[0xc] = opt->use_local_pool_allocator;
    auStack_270[0xd] = opt->use_reserved_1;
    auStack_270[0xe] = opt->use_reserved_2;
    auStack_270[0xf] = opt->use_reserved_3;
    uStack_260._0_1_ = opt->use_reserved_4;
    uStack_260._1_1_ = opt->use_reserved_5;
    uStack_260._2_1_ = opt->use_reserved_6;
    uStack_260._3_1_ = opt->use_reserved_7;
    uStack_260._4_1_ = opt->use_reserved_8;
    uStack_260._5_1_ = opt->use_reserved_9;
    uStack_260._6_1_ = opt->use_reserved_10;
    uStack_260._7_1_ = opt->use_reserved_11;
    local_298._0_4_ = (undefined4)uVar15;
    local_298._8_4_ = SUB84(opt->workspace_allocator,0);
    local_298._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_298._4_4_ = uVar15._4_4_;
    local_298._24_4_ = uVar16;
    local_298._28_4_ = uVar18;
    convert_packing(&local_248,(Mat *)local_338,local_354,(Option *)local_298);
  }
  piVar3 = top_blob->refcount;
  local_298._0_4_ = SUB84(top_blob->data,0);
  local_298._4_4_ = (undefined4)((ulong)top_blob->data >> 0x20);
  local_298._8_4_ = SUB84(top_blob->refcount,0);
  local_298._12_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
  local_298._16_8_ = top_blob->elemsize;
  local_298._24_4_ = top_blob->elempack;
  local_298._32_8_ = top_blob->allocator;
  auStack_270._0_4_ = top_blob->dims;
  auStack_270._4_4_ = top_blob->w;
  auStack_270._8_4_ = top_blob->h;
  auStack_270._12_4_ = top_blob->d;
  uStack_260 = CONCAT44(uStack_260._4_4_,top_blob->c);
  local_258 = top_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (uVar27 < (uint)local_2d0) {
    Mat::create((Mat *)local_298,iVar38,iVar43,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) /
                (int)uVar27,(ulong)((int)(uVar35 / (local_2d0 & 0xffffffff)) * uVar27),uVar27,
                opt->workspace_allocator);
    iVar30 = -100;
    if ((CONCAT44(local_298._4_4_,local_298._0_4_) != 0) && ((long)(int)uStack_260 * local_258 != 0)
       ) goto LAB_002993e3;
  }
  else {
LAB_002993e3:
    local_2a8._0_8_ = opt;
    if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3])) {
      iVar28 = (int)local_2e0 / local_354;
      iVar38 = (int)local_2e8 / (int)uVar27;
      iVar45 = 0;
      iVar43 = 0;
      lVar33 = 0;
      do {
        if (local_318._8_4_ == 3) {
          local_1d0._4_4_ = local_318._12_4_;
          local_1d0._0_4_ = 3;
          local_1d0._8_4_ = local_318._16_4_;
          local_1d0._12_4_ = 1;
          lVar36 = (long)(int)local_318._16_4_ * (long)(int)local_318._12_4_ * local_338._16_8_;
        }
        else {
          local_1d0._4_4_ = local_318._12_4_;
          local_1d0._0_4_ = 4;
          local_1d0._8_4_ = local_318._16_4_;
          local_1d0._12_4_ = local_318._20_4_;
          lVar36 = (long)(int)local_318._16_4_ * (long)(int)local_318._12_4_ *
                   (long)(int)local_318._20_4_ * local_338._16_8_;
        }
        local_1f8 = (pointer)((long)(iVar45 / local_354) * local_2f8 * local_338._16_8_ +
                             local_338._0_8_);
        local_1d8 = (Allocator *)local_318._0_8_;
        local_1e0 = local_338._24_4_;
        uStack_1ec = 0;
        uStack_1f0 = 0;
        local_1e8 = (Allocator *)local_338._16_8_;
        local_1b8 = (lVar36 + 0xfU & 0xfffffffffffffff0) / (ulong)local_338._16_8_;
        if (auStack_270._0_4_ == 3) {
          local_1a8 = (void *)((long)(iVar43 / (int)uVar27) * local_258 * local_298._16_8_ +
                              CONCAT44(local_298._4_4_,local_298._0_4_));
          local_180._4_4_ = auStack_270._4_4_;
          local_180._0_4_ = 3;
          local_180._8_4_ = auStack_270._8_4_;
          local_180._12_4_ = 1;
          lVar36 = (long)(int)auStack_270._8_4_ * (long)(int)auStack_270._4_4_ * local_298._16_8_;
        }
        else {
          local_1a8 = (void *)((long)(iVar43 / (int)uVar27) * local_258 * local_298._16_8_ +
                              CONCAT44(local_298._4_4_,local_298._0_4_));
          local_180._4_4_ = auStack_270._4_4_;
          local_180._0_4_ = 4;
          local_180._8_4_ = auStack_270._8_4_;
          local_180._12_4_ = auStack_270._12_4_;
          lVar36 = (long)(int)auStack_270._8_4_ * (long)(int)auStack_270._4_4_ *
                   (long)(int)auStack_270._12_4_ * local_298._16_8_;
        }
        local_188 = (Allocator *)local_298._32_8_;
        local_190 = local_298._24_4_;
        uStack_19c = 0;
        uStack_1a0 = 0;
        local_198 = (Allocator *)local_298._16_8_;
        local_168 = (lVar36 + 0xfU & 0xfffffffffffffff0) / (ulong)local_298._16_8_;
        pLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar33];
        local_78 = *(undefined8 *)local_2a8._0_8_;
        uStack_68 = *(undefined8 *)(local_2a8._0_8_ + 0x10);
        uStack_60 = *(undefined8 *)(local_2a8._0_8_ + 0x18);
        local_58 = *(undefined8 *)(local_2a8._0_8_ + 0x20);
        uStack_50 = *(undefined8 *)(local_2a8._0_8_ + 0x28);
        uStack_48 = *(undefined8 *)(local_2a8._0_8_ + 0x30);
        uStack_40 = *(undefined8 *)(local_2a8._0_8_ + 0x38);
        pAStack_70 = top_blob->allocator;
        local_1c0 = iVar28;
        local_170 = iVar38;
        (*pLVar5->_vptr_Layer[7])(pLVar5,&local_1f8,&local_1a8,&local_78);
        piVar3 = (int *)CONCAT44(uStack_19c,uStack_1a0);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_188 == (Allocator *)0x0) {
              if (local_1a8 != (void *)0x0) {
                free(local_1a8);
              }
            }
            else {
              (*local_188->_vptr_Allocator[3])();
            }
          }
        }
        local_168 = 0;
        local_1a8 = (void *)0x0;
        uStack_1a0 = 0;
        uStack_19c = 0;
        local_198 = (Allocator *)0x0;
        local_190 = 0;
        local_180 = (undefined1  [16])0x0;
        local_170 = 0;
        piVar3 = (int *)CONCAT44(uStack_1ec,uStack_1f0);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_1d8 == (Allocator *)0x0) {
              if (local_1f8 != (pointer)0x0) {
                free(local_1f8);
              }
            }
            else {
              (*local_1d8->_vptr_Allocator[3])();
            }
          }
        }
        local_1b8 = 0;
        local_1f8._0_4_ = 0.0;
        local_1f8._4_4_ = 0;
        uStack_1f0 = 0;
        uStack_1ec = 0;
        local_1e8 = (Allocator *)0x0;
        local_1e0 = 0;
        local_1d0 = (undefined1  [16])0x0;
        local_1c0 = 0;
        lVar33 = lVar33 + 1;
        iVar43 = iVar43 + (int)local_2e8;
        iVar45 = iVar45 + (int)local_2e0;
      } while (lVar33 < *(int *)(&this->field_0x108 +
                                (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
    }
    if (uVar27 < (uint)local_2d0) {
      convert_packing((Mat *)local_298,top_blob,(uint)local_2d0,(Option *)local_2a8._0_8_);
      iVar30 = 0;
    }
    else {
      iVar30 = 0;
      if ((Mat *)local_298 != top_blob) {
        piVar3 = (int *)CONCAT44(local_298._12_4_,local_298._8_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        auVar76 = auStack_270;
        iVar30 = 0;
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = (void *)CONCAT44(local_298._4_4_,local_298._0_4_);
        top_blob->refcount = (int *)CONCAT44(local_298._12_4_,local_298._8_4_);
        top_blob->elemsize = local_298._16_8_;
        top_blob->elempack = local_298._24_4_;
        top_blob->allocator = (Allocator *)local_298._32_8_;
        top_blob->dims = auStack_270._0_4_;
        top_blob->w = auStack_270._4_4_;
        top_blob->h = auStack_270._8_4_;
        top_blob->d = auStack_270._12_4_;
        top_blob->c = (int)uStack_260;
        top_blob->cstep = local_258;
        auStack_270 = auVar76;
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_298._12_4_,local_298._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_298._32_8_ == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_298._4_4_,local_298._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_298._4_4_,local_298._0_4_));
        }
      }
      else {
        (*(*(_func_int ***)local_298._32_8_)[3])();
      }
    }
  }
  local_258 = 0;
  local_298._0_4_ = 0.0;
  local_298._4_4_ = 0;
  local_298._8_4_ = 0;
  local_298._12_4_ = 0;
  local_298._16_8_ = (Allocator *)0x0;
  local_298._24_4_ = 0;
  auStack_270 = (undefined1  [16])0x0;
  uStack_260 = uStack_260 & 0xffffffff00000000;
  piVar3 = (int *)CONCAT44(local_338._12_4_,local_338._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_318._0_8_ == (Allocator *)0x0) {
        if ((pointer)local_338._0_8_ != (pointer)0x0) {
          free((void *)local_338._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_318._0_8_)[3])();
      }
    }
  }
  local_2f8 = 0;
  local_338._0_8_ = (pointer)0x0;
  local_338._8_8_ = (Allocator *)0x0;
  local_338._16_8_ = (Allocator *)0x0;
  local_338._24_4_ = 0;
  local_318._0_28_ = ZEXT828((ulong)local_318._0_8_);
LAB_0029a0fa:
  piVar3 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        if ((pointer)local_248.data != (pointer)0x0) {
          free(local_248.data);
        }
      }
      else {
        (*(local_248.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_128._12_4_,local_128._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_128._32_8_ == (Allocator *)0x0) {
        if ((void *)local_128._0_8_ != (void *)0x0) {
          free((void *)local_128._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_128._32_8_)[3])();
      }
    }
  }
  return iVar30;
}

Assistant:

int ConvolutionDepthWise_x86_avx2::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_int8 + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}